

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temper.cpp
# Opt level: O0

void applyInstrument(MidiFile *midifile,int timbre)

{
  int iVar1;
  MidiEventList *this;
  int local_68;
  int local_54;
  int chan;
  int i;
  MidiEvent pcMessage;
  int track;
  int timbre_local;
  MidiFile *midifile_local;
  
  pcMessage.m_eventlink._0_4_ = 0;
  pcMessage.m_eventlink._4_4_ = timbre;
  iVar1 = smf::MidiFile::getTrackCount(midifile);
  if (1 < iVar1) {
    pcMessage.m_eventlink._0_4_ = 1;
  }
  smf::MidiEvent::MidiEvent((MidiEvent *)&chan);
  pcMessage.super_MidiMessage.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  for (local_54 = 0; local_54 < 0xc; local_54 = local_54 + 1) {
    if (local_54 < 9) {
      local_68 = local_54;
    }
    else {
      local_68 = local_54 + 1;
    }
    smf::MidiMessage::makePatchChange((MidiMessage *)&chan,local_68,pcMessage.m_eventlink._4_4_);
    this = smf::MidiFile::operator[](midifile,(int)pcMessage.m_eventlink);
    smf::MidiEventList::append(this,(MidiEvent *)&chan);
  }
  smf::MidiEvent::~MidiEvent((MidiEvent *)&chan);
  return;
}

Assistant:

void applyInstrument(MidiFile& midifile, int timbre) {
	int track = 0;
	if (midifile.getTrackCount() > 1) {
		track = 1;
	}
	MidiEvent pcMessage;
	pcMessage.tick = 0;  // add messages at start of track (after sorting)
	for (int i=0; i<12; i++) {
		int chan = (i < 0x09) ? i : i+1;
		pcMessage.makePatchChange(chan, timbre);
		midifile[track].append(pcMessage);
	}
}